

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_expand.cxx
# Opt level: O2

int fl_filename_expand(char *to,int tolen,char *from)

{
  char *__src;
  char cVar1;
  int iVar2;
  char *dst;
  size_t sVar3;
  passwd *ppVar4;
  char *__s;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  char *size;
  char *__dest;
  char *pcVar8;
  char *local_68;
  
  size = (char *)(long)tolen;
  dst = (char *)operator_new__((ulong)size);
  fl_strlcpy(dst,from,(size_t)size);
  sVar3 = strlen(dst);
  pcVar8 = dst + sVar3;
  iVar2 = 0;
  __dest = dst;
  local_68 = dst;
LAB_001ffdb6:
  do {
    if (pcVar8 <= __dest) {
      fl_strlcpy(to,local_68,(size_t)size);
      operator_delete__(dst);
      return iVar2;
    }
    pcVar7 = pcVar8 + (1 - (long)__dest);
    lVar6 = 0;
    for (uVar5 = 0; (__src = __dest + uVar5, __src < pcVar8 && (*__src != '/')); uVar5 = uVar5 + 1)
    {
      pcVar7 = pcVar7 + -1;
      lVar6 = lVar6 + -1;
    }
    if (*__dest == '$') {
      cVar1 = *__src;
      *__src = '\0';
      __s = fl_getenv(__dest + 1);
      *__src = cVar1;
    }
    else {
      if (*__dest != '~') break;
      if (uVar5 < 2) {
        __s = fl_getenv("HOME");
      }
      else {
        cVar1 = *__src;
        *__src = '\0';
        ppVar4 = getpwnam(__dest + 1);
        *__src = cVar1;
        if (ppVar4 == (passwd *)0x0) break;
        __s = ppVar4->pw_dir;
      }
    }
    if (__s == (char *)0x0) break;
    if (*__s == '/') {
      local_68 = __dest;
    }
    sVar3 = strlen(__s);
    sVar3 = (size_t)(int)((int)sVar3 - (uint)(__s[(int)sVar3 + -1] == '/'));
    pcVar8 = pcVar7 + sVar3;
    if ((long)size <= (long)(pcVar7 + sVar3)) {
      pcVar8 = size;
    }
    memmove(__dest + sVar3,__src,
            (size_t)(__dest + (long)(pcVar8 + ((-lVar6 - sVar3) - (long)__src))));
    pcVar8 = __dest + sVar3 +
             (long)(__dest + (long)(pcVar8 + ((-lVar6 - sVar3) - (long)__src)) + -1);
    *pcVar8 = '\0';
    memcpy(__dest,__s,sVar3);
    iVar2 = iVar2 + 1;
  } while( true );
  __dest = __dest + uVar5 + 1;
  goto LAB_001ffdb6;
}

Assistant:

int fl_filename_expand(char *to,int tolen, const char *from) {

  char *temp = new char[tolen];
  strlcpy(temp,from, tolen);
  char *start = temp;
  char *end = temp+strlen(temp);

  int ret = 0;

  for (char *a=temp; a<end; ) {	// for each slash component
    char *e; for (e=a; e<end && !isdirsep(*e); e++) {/*empty*/} // find next slash
    const char *value = 0; // this will point at substitute value
    switch (*a) {
    case '~':	// a home directory name
      if (e <= a+1) {	// current user's directory
        value = fl_getenv("HOME");
#ifndef WIN32
      } else {	// another user's directory
	struct passwd *pwd;
	char t = *e; *(char *)e = 0; 
        pwd = getpwnam(a+1); 
        *(char *)e = t;
	    if (pwd) value = pwd->pw_dir;
#endif
      }
      break;
    case '$':		/* an environment variable */
      {char t = *e; *(char *)e = 0; value = fl_getenv(a+1); *(char *)e = t;}
      break;
    }
    if (value) {
      // substitutions that start with slash delete everything before them:
      if (isdirsep(value[0])) start = a;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      // also if it starts with "A:"
      if (value[0] && value[1]==':') start = a;
#endif
      int t = (int) strlen(value); if (isdirsep(value[t-1])) t--;
      if ((end+1-e+t) >= tolen) end += tolen - (end+1-e+t);
      memmove(a+t, e, end+1-e);
      end = a+t+(end-e);
      *end = '\0';
      memcpy(a, value, t);
      ret++;
    } else {
      a = e+1;
#if defined(WIN32) || defined(__EMX__) && !defined(__CYGWIN__)
      if (*e == '\\') {*e = '/'; ret++;} // ha ha!
#endif
    }
  }

  strlcpy(to, start, tolen);

  delete[] temp;

  return ret;
}